

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_2e1d52a::DescriptorImpl::ToStringHelper
          (DescriptorImpl *this,SigningProvider *arg,string *out,StringType type,
          DescriptorCache *cache)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer puVar3;
  PubkeyProvider *pPVar4;
  char cVar5;
  int iVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  pointer puVar9;
  undefined8 uVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  bool bVar12;
  string subscript;
  string ret;
  string extra;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118 [2];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  long *local_58;
  size_type local_50;
  long local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (*(this->super_Descriptor)._vptr_Descriptor[0x10])(&local_58,this);
  bVar12 = local_50 != 0;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  pcVar1 = (this->m_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar1,pcVar1 + (this->m_name)._M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_98,"(");
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_98,(char *)local_58,local_50);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar7->_M_dataplus)._M_p;
  paVar8 = &pbVar7->field_2;
  if (paVar2 == paVar8) {
    local_78.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_78.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_78.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_78._M_dataplus._M_p = (pointer)paVar2;
  }
  uVar11 = (ulong)bVar12;
  local_78._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
  puVar9 = (this->m_pubkey_args).
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->m_pubkey_args).
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar9 != puVar3) {
    do {
      if (uVar11 != 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&local_78,",");
      }
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      local_98._M_string_length = 0;
      local_98.field_2._M_local_buf[0] = '\0';
      switch(type) {
      case PUBLIC:
        pPVar4 = (puVar9->_M_t).
                 super___uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                 .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>._M_head_impl
        ;
        (*pPVar4->_vptr_PubkeyProvider[5])(local_b8,pPVar4,0);
        (anonymous_namespace)::DescriptorImpl::ToStringHelper();
        break;
      case PRIVATE:
        pPVar4 = (puVar9->_M_t).
                 super___uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                 .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>._M_head_impl
        ;
        iVar6 = (*pPVar4->_vptr_PubkeyProvider[6])(pPVar4,arg,&local_98);
        cVar5 = (char)iVar6;
        goto LAB_00705fa2;
      case NORMALIZED:
        pPVar4 = (puVar9->_M_t).
                 super___uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                 .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>._M_head_impl
        ;
        iVar6 = (*pPVar4->_vptr_PubkeyProvider[7])(pPVar4,arg,&local_98,cache);
        cVar5 = (char)iVar6;
LAB_00705fa2:
        if (cVar5 == '\0') {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,
                            CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                                     local_98.field_2._M_local_buf[0]) + 1);
          }
          cVar5 = '\0';
          goto LAB_00706100;
        }
        break;
      case COMPAT:
        pPVar4 = (puVar9->_M_t).
                 super___uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                 .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>._M_head_impl
        ;
        (*pPVar4->_vptr_PubkeyProvider[5])(local_d8,pPVar4,1);
        (anonymous_namespace)::DescriptorImpl::ToStringHelper();
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_78,local_98._M_dataplus._M_p,local_98._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,
                        CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                                 local_98.field_2._M_local_buf[0]) + 1);
      }
      puVar9 = puVar9 + 1;
      uVar11 = uVar11 + 1;
    } while (puVar9 != puVar3);
  }
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  iVar6 = (*(this->super_Descriptor)._vptr_Descriptor[0x12])(this,arg,&local_98,(ulong)type,cache);
  cVar5 = (char)iVar6;
  if (cVar5 == '\0') goto LAB_007060aa;
  if (local_98._M_string_length != 0 && uVar11 != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (&local_78,',');
  }
  uVar10 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    uVar10 = local_78.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar10 < local_98._M_string_length + local_78._M_string_length) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      uVar11 = CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                        local_98.field_2._M_local_buf[0]);
    }
    if (uVar11 < local_98._M_string_length + local_78._M_string_length) goto LAB_007061ed;
    pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_98,0,0,local_78._M_dataplus._M_p,local_78._M_string_length);
  }
  else {
LAB_007061ed:
    pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_78,local_98._M_dataplus._M_p,local_98._M_string_length);
  }
  local_118[0]._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
  paVar2 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118[0]._M_dataplus._M_p == paVar2) {
    local_118[0].field_2._0_8_ = paVar2->_M_allocated_capacity;
    local_118[0].field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    local_118[0]._M_dataplus._M_p = (pointer)&local_118[0].field_2;
  }
  else {
    local_118[0].field_2._0_8_ = paVar2->_M_allocated_capacity;
  }
  local_118[0]._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar2;
  pbVar7->_M_string_length = 0;
  paVar2->_M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (local_118,")");
  (anonymous_namespace)::DescriptorImpl::ToStringHelper();
LAB_007060aa:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
LAB_00706100:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)cVar5;
}

Assistant:

virtual bool ToStringHelper(const SigningProvider* arg, std::string& out, const StringType type, const DescriptorCache* cache = nullptr) const
    {
        std::string extra = ToStringExtra();
        size_t pos = extra.size() > 0 ? 1 : 0;
        std::string ret = m_name + "(" + extra;
        for (const auto& pubkey : m_pubkey_args) {
            if (pos++) ret += ",";
            std::string tmp;
            switch (type) {
                case StringType::NORMALIZED:
                    if (!pubkey->ToNormalizedString(*arg, tmp, cache)) return false;
                    break;
                case StringType::PRIVATE:
                    if (!pubkey->ToPrivateString(*arg, tmp)) return false;
                    break;
                case StringType::PUBLIC:
                    tmp = pubkey->ToString();
                    break;
                case StringType::COMPAT:
                    tmp = pubkey->ToString(PubkeyProvider::StringType::COMPAT);
                    break;
            }
            ret += tmp;
        }
        std::string subscript;
        if (!ToStringSubScriptHelper(arg, subscript, type, cache)) return false;
        if (pos && subscript.size()) ret += ',';
        out = std::move(ret) + std::move(subscript) + ")";
        return true;
    }